

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncheck.cpp
# Opt level: O1

bool validate(char *dirname)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  char *__dest;
  long lVar9;
  uchar *__ptr;
  char *__s;
  ulong uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  dirent **entry_list;
  ParsedJson pj;
  undefined4 local_ec;
  allocator<char> local_e5;
  uint local_e4;
  uint local_e0;
  undefined4 local_dc;
  dirent **local_d8;
  void *local_d0;
  char *local_c8;
  long local_c0;
  size_t local_b8;
  long local_b0;
  char *local_a8;
  long local_a0;
  ulong local_98;
  long *local_90 [2];
  long local_80 [10];
  
  local_b8 = strlen(dirname);
  uVar4 = scandir(dirname,&local_d8,(__selector *)0x0,alphasort);
  if ((int)uVar4 < 0) {
    bVar2 = 0;
    fprintf(_stderr,"error accessing %s \n",dirname);
  }
  else if (uVar4 == 0) {
    bVar2 = 0;
    printf("nothing in dir %s \n",dirname);
  }
  else {
    uVar7 = (ulong)uVar4;
    local_d0 = operator_new__(uVar7);
    local_98 = uVar7;
    memset(local_d0,1,uVar7);
    sVar6 = strlen(dirname);
    if (sVar6 < 2) {
      local_dc = 0;
    }
    else {
      local_dc = (undefined4)CONCAT71((int7)(sVar6 >> 8),dirname[sVar6 - 1] != '/');
    }
    local_b0 = local_b8 + 2;
    uVar7 = 1;
    if (1 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    local_a0 = -uVar7;
    bVar11 = true;
    uVar7 = 1;
    local_ec = (undefined4)local_a0;
    local_e0 = (uint)CONCAT71((int7)((ulong)local_a0 >> 8),1);
    local_c0 = 0;
    local_e4 = uVar4;
    local_a8 = dirname;
    do {
      __s = local_d8[uVar7 - 1]->d_name;
      pcVar8 = strrchr(__s,0x2e);
      if ((pcVar8 == (char *)0x0) || (iVar5 = strcmp(pcVar8,".json"), iVar5 != 0)) {
        cVar1 = '\x01';
      }
      else {
        printf("validating: file %s ",__s);
        fflush((FILE *)0x0);
        sVar6 = strlen(__s);
        __dest = (char *)malloc(sVar6 + local_b0);
        strcpy(__dest,local_a8);
        pcVar8 = __dest + local_b8;
        if ((char)local_dc != '\0') {
          *pcVar8 = '/';
          pcVar8 = pcVar8 + 1;
        }
        local_c8 = __dest;
        strcpy(pcVar8,__s);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_90,local_c8,&local_e5);
        auVar12 = get_corpus((string *)local_90);
        __ptr = auVar12._8_8_;
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        ParsedJson::ParsedJson((ParsedJson *)local_90);
        cVar1 = ParsedJson::allocateCapacity((ulong)local_90,auVar12._0_8_);
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"can\'t allocate memory",0x15);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
          local_ec = 0;
        }
        else {
          bVar2 = json_parse(__ptr,auVar12._0_8_,(ParsedJson *)local_90,true);
          if (__ptr != (uchar *)0x0) {
            free(__ptr);
          }
          pcVar8 = "invalid";
          if (bVar2 != 0) {
            pcVar8 = "ok";
          }
          puts(pcVar8);
          pcVar8 = strstr(__s,"EXCLUDE");
          if (pcVar8 == (char *)0x0) {
            local_c0 = local_c0 + 1;
            bVar3 = startsWith("pass",__s);
            if (bVar3) {
              pcVar8 = "warning: file %s should pass but it fails.\n";
              if (bVar2 == 0) {
LAB_00102785:
                *(undefined1 *)((long)local_d0 + (uVar7 - 1)) = 0;
                local_e0 = 0;
                printf(pcVar8,__s);
              }
            }
            else {
              bVar3 = startsWith("fail",__s);
              pcVar8 = "warning: file %s should fail but it passes.\n";
              if ((bVar2 & bVar3) == 1) goto LAB_00102785;
            }
          }
          free(local_c8);
        }
        ParsedJson::~ParsedJson((ParsedJson *)local_90);
      }
      if (cVar1 == '\0') break;
      bVar11 = uVar7 < local_98;
      lVar9 = local_a0 + uVar7;
      uVar7 = uVar7 + 1;
    } while (lVar9 != 0);
    bVar2 = (byte)local_ec;
    if (!bVar11) {
      printf("%zu files checked.\n",local_c0);
      uVar4 = local_e4;
      bVar2 = (byte)local_e0;
      if ((local_e0 & 1) == 0) {
        validate();
      }
      else {
        puts("All ok!");
        uVar4 = local_e4;
      }
      uVar7 = 1;
      if (1 < (int)uVar4) {
        uVar7 = (ulong)uVar4;
      }
      uVar10 = 0;
      do {
        free(local_d8[uVar10]);
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
      free(local_d8);
      operator_delete__(local_d0);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool validate(const char *dirname) {
  bool everythingfine = true;
  const char *extension = ".json";
  size_t dirlen = strlen(dirname);
  struct dirent **entry_list;
  int c = scandir(dirname, &entry_list, nullptr, alphasort);
  if (c < 0) {
    fprintf(stderr, "error accessing %s \n", dirname);
    return false;
  }
  if (c == 0) {
    printf("nothing in dir %s \n", dirname);
    return false;
  }
  bool * isfileasexpected = new bool[c];
  for(int i = 0; i < c; i++) { isfileasexpected[i] = true;
}
  size_t howmany = 0;
  bool needsep = (strlen(dirname) > 1) && (dirname[strlen(dirname) - 1] != '/');
  for (int i = 0; i < c; i++) {
    const char *name = entry_list[i]->d_name;
    if (hasExtension(name, extension)) {
      printf("validating: file %s ", name);
      fflush(nullptr);
      size_t filelen = strlen(name);
      char *fullpath = static_cast<char *>(malloc(dirlen + filelen + 1 + 1));
      strcpy(fullpath, dirname);
      if (needsep) {
        fullpath[dirlen] = '/';
        strcpy(fullpath + dirlen + 1, name);
      } else {
        strcpy(fullpath + dirlen, name);
      }
      std::string_view p;
      try {
        p = get_corpus(fullpath);
      } catch (const std::exception& e) {
        std::cerr << "Could not load the file " << fullpath << std::endl;
        return EXIT_FAILURE;
      }
      ParsedJson pj;
      bool allocok = pj.allocateCapacity(p.size(), 1024);
      if(!allocok) {
        std::cerr << "can't allocate memory"<<std::endl;
        return false;
      }
      ++howmany;
      bool isok = json_parse(p, pj);
      aligned_free((void*)p.data());
      printf("%s\n", isok ? "ok" : "invalid");
      if(contains("EXCLUDE",name)) {
        // skipping
        howmany--;
      } else if (startsWith("pass", name)) {
        if (!isok) {
          isfileasexpected[i] = false;
          printf("warning: file %s should pass but it fails.\n", name);
          everythingfine = false;
        }
      } else if (startsWith("fail", name)) {
        if (isok) {
          isfileasexpected[i] = false;
          printf("warning: file %s should fail but it passes.\n", name);
          everythingfine = false;
        }
      }
      free(fullpath);
    }
  }
  printf("%zu files checked.\n", howmany);
  if(everythingfine) {
    printf("All ok!\n");
  } else {
    fprintf(stderr, "There were problems! Consider reviewing the following files:\n");
    for(int i = 0; i < c; i++) {
      if(!isfileasexpected[i]) { fprintf(stderr, "%s \n", entry_list[i]->d_name);
}
    }
  }
  for (int i = 0; i < c; ++i) {
    free(entry_list[i]);
}
  free(entry_list);
  delete[] isfileasexpected;
  return everythingfine;
}